

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

AnonymousProgramSymbol *
slang::ast::AnonymousProgramSymbol::fromSyntax(Scope *scope,AnonymousProgramSyntax *syntax)

{
  Compilation *args;
  size_t sVar1;
  pointer ppMVar2;
  AnonymousProgramSymbol *pAVar3;
  TransparentMemberSymbol *member;
  Symbol *args_00;
  long lVar4;
  SourceLocation local_38;
  
  args = scope->compilation;
  local_38 = parsing::Token::location(&syntax->keyword);
  pAVar3 = BumpAllocator::
           emplace<slang::ast::AnonymousProgramSymbol,slang::ast::Compilation&,slang::SourceLocation>
                     (&args->super_BumpAllocator,args,&local_38);
  (pAVar3->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  sVar1 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppMVar2 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar4 = 0;
    do {
      Scope::addMembers(&pAVar3->super_Scope,*(SyntaxNode **)((long)ppMVar2 + lVar4));
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  for (args_00 = (pAVar3->super_Scope).firstMember; args_00 != (Symbol *)0x0;
      args_00 = args_00->nextInScope) {
    member = BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                       (&args->super_BumpAllocator,args_00);
    Scope::insertMember(scope,&member->super_Symbol,scope->lastMember,false,true);
  }
  return pAVar3;
}

Assistant:

AnonymousProgramSymbol& AnonymousProgramSymbol::fromSyntax(Scope& scope,
                                                           const AnonymousProgramSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<AnonymousProgramSymbol>(comp, syntax.keyword.location());
    result->setSyntax(syntax);

    for (auto member : syntax.members)
        result->addMembers(*member);

    // All members also get hoisted into the parent scope.
    for (auto member = result->getFirstMember(); member; member = member->getNextSibling())
        scope.addMember(*comp.emplace<TransparentMemberSymbol>(*member));

    return *result;
}